

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall
Messages::Person_PhoneNumber::InternalSwap(Person_PhoneNumber *this,Person_PhoneNumber *other)

{
  bool bVar1;
  undefined1 *this_00;
  Container<google::protobuf::UnknownFieldSet> *pCVar2;
  string *default_value;
  Arena *arena;
  string *psVar3;
  Person_PhoneNumber *other_local;
  Person_PhoneNumber *this_local;
  UnknownFieldSet *local_70;
  string *other_ptr;
  string *this_ptr;
  
  this_00 = &other->field_0x8;
  if ((((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) ||
     (((uint)*(undefined8 *)this_00 & 1) == 1)) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)this_00);
      local_70 = &pCVar2->unknown_fields;
    }
    else {
      local_70 = google::protobuf::internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                           ((InternalMetadata *)this_00);
    }
    google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,local_70);
  }
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->number_,default_value);
  if ((!bVar1) ||
     (bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&other->number_,default_value),
     !bVar1)) {
    psVar3 = google::protobuf::internal::ArenaStringPtr::Mutable(&this->number_,default_value,arena)
    ;
    google::protobuf::internal::ArenaStringPtr::Mutable(&other->number_,default_value,arena);
    std::__cxx11::string::swap((string *)psVar3);
  }
  std::swap<int>(&this->type_,&other->type_);
  return;
}

Assistant:

void Person_PhoneNumber::InternalSwap(Person_PhoneNumber* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  number_.Swap(&other->number_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(type_, other->type_);
}